

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,StringPiece name,int *value)

{
  internal *piVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *__n;
  char *__n_00;
  difference_type __d;
  EnumEntry *pEVar5;
  
  __n = name.ptr_;
  piVar1 = this + (long)enums * 0x18;
  if (0 < (long)enums) {
    do {
      pEVar5 = (EnumEntry *)((ulong)enums >> 1);
      pcVar2 = *(char **)(this + (long)pEVar5 * 0x18 + 8);
      __n_00 = pcVar2;
      if ((long)__n <= (long)pcVar2) {
        __n_00 = __n;
      }
      iVar4 = memcmp(*(void **)(this + (long)pEVar5 * 0x18),(void *)size,(size_t)__n_00);
      if ((iVar4 < 0) || ((long)pcVar2 < (long)__n && iVar4 == 0)) {
        this = this + (long)pEVar5 * 0x18 + 0x18;
        pEVar5 = (EnumEntry *)((long)&(enums->name).ptr_ + ~(ulong)pEVar5);
      }
      enums = pEVar5;
    } while (0 < (long)pEVar5);
  }
  if (((this == piVar1) || (*(char **)(this + 8) != __n)) ||
     ((0 < (long)__n && *(void **)this != (void *)size &&
      (iVar4 = bcmp(*(void **)this,(void *)size,(size_t)__n), iVar4 != 0)))) {
    bVar3 = false;
  }
  else {
    *(undefined4 *)name.length_ = *(undefined4 *)(this + 0x10);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     StringPiece name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}